

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O1

void __thiscall tinyusdz::Property::Property(Property *this,Attribute *a,bool custom)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Rb_tree_header *p_Var3;
  pointer pcVar4;
  vtable_type *pvVar5;
  undefined8 uVar6;
  
  paVar1 = &(this->_attrib)._name.field_2;
  (this->_attrib)._name._M_dataplus._M_p = (pointer)paVar1;
  pcVar4 = (a->_name)._M_dataplus._M_p;
  paVar2 = &(a->_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 == paVar2) {
    uVar6 = *(undefined8 *)((long)&(a->_name).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->_attrib)._name.field_2 + 8) = uVar6;
  }
  else {
    (this->_attrib)._name._M_dataplus._M_p = pcVar4;
    (this->_attrib)._name.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->_attrib)._name._M_string_length = (a->_name)._M_string_length;
  (a->_name)._M_dataplus._M_p = (pointer)paVar2;
  (a->_name)._M_string_length = 0;
  (a->_name).field_2._M_local_buf[0] = '\0';
  (this->_attrib)._variability = a->_variability;
  (this->_attrib)._varying_authored = a->_varying_authored;
  paVar1 = &(this->_attrib)._type_name.field_2;
  (this->_attrib)._type_name._M_dataplus._M_p = (pointer)paVar1;
  pcVar4 = (a->_type_name)._M_dataplus._M_p;
  paVar2 = &(a->_type_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 == paVar2) {
    uVar6 = *(undefined8 *)((long)&(a->_type_name).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->_attrib)._type_name.field_2 + 8) = uVar6;
  }
  else {
    (this->_attrib)._type_name._M_dataplus._M_p = pcVar4;
    (this->_attrib)._type_name.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->_attrib)._type_name._M_string_length = (a->_type_name)._M_string_length;
  (a->_type_name)._M_dataplus._M_p = (pointer)paVar2;
  (a->_type_name)._M_string_length = 0;
  (a->_type_name).field_2._M_local_buf[0] = '\0';
  (this->_attrib)._var._value.v_.vtable = (a->_var)._value.v_.vtable;
  pvVar5 = (a->_var)._value.v_.vtable;
  if (pvVar5 != (vtable_type *)0x0) {
    (*pvVar5->move)((storage_union *)&a->_var,(storage_union *)&(this->_attrib)._var);
    (a->_var)._value.v_.vtable = (vtable_type *)0x0;
  }
  (this->_attrib)._var._blocked = (a->_var)._blocked;
  (this->_attrib)._var._ts._samples.
  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (a->_var)._ts._samples.
       super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
       ._M_impl.super__Vector_impl_data._M_start;
  *(pointer *)
   ((long)&(this->_attrib)._var._ts._samples.
           super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
           ._M_impl.super__Vector_impl_data + 8) =
       (a->_var)._ts._samples.
       super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  *(pointer *)
   ((long)&(this->_attrib)._var._ts._samples.
           super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
           ._M_impl.super__Vector_impl_data + 0x10) =
       (a->_var)._ts._samples.
       super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (a->_var)._ts._samples.
  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (a->_var)._ts._samples.
  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (a->_var)._ts._samples.
  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_attrib)._var._ts._dirty = (a->_var)._ts._dirty;
  (this->_attrib)._paths.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl
  .super__Vector_impl_data._M_start =
       (a->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->_attrib)._paths.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl
  .super__Vector_impl_data._M_finish =
       (a->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->_attrib)._paths.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage =
       (a->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (a->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (a->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (a->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  AttrMetas::AttrMetas(&(this->_attrib)._metas,&a->_metas);
  this->_listOpQual = ResetToExplicit;
  this->_type = EmptyAttrib;
  (this->_rel).type = DefineOnly;
  (this->_rel).targetPath._prim_part._M_dataplus._M_p =
       (pointer)&(this->_rel).targetPath._prim_part.field_2;
  (this->_rel).targetPath._prim_part._M_string_length = 0;
  (this->_rel).targetPath._prim_part.field_2._M_local_buf[0] = '\0';
  (this->_rel).targetPath._prop_part._M_dataplus._M_p =
       (pointer)&(this->_rel).targetPath._prop_part.field_2;
  (this->_rel).targetPath._prop_part._M_string_length = 0;
  (this->_rel).targetPath._prop_part.field_2._M_local_buf[0] = '\0';
  (this->_rel).targetPath._variant_part._M_dataplus._M_p =
       (pointer)&(this->_rel).targetPath._variant_part.field_2;
  (this->_rel).targetPath._variant_part._M_string_length = 0;
  (this->_rel).targetPath._variant_part.field_2._M_local_buf[0] = '\0';
  (this->_rel).targetPath._variant_selection_part._M_dataplus._M_p =
       (pointer)&(this->_rel).targetPath._variant_selection_part.field_2;
  (this->_rel).targetPath._variant_selection_part._M_string_length = 0;
  (this->_rel).targetPath._variant_selection_part.field_2._M_local_buf[0] = '\0';
  (this->_rel).targetPath._variant_part_str._M_dataplus._M_p =
       (pointer)&(this->_rel).targetPath._variant_part_str.field_2;
  (this->_rel).targetPath._variant_part_str._M_string_length = 0;
  (this->_rel).targetPath._variant_part_str.field_2._M_local_buf[0] = '\0';
  (this->_rel).targetPath._element._M_dataplus._M_p =
       (pointer)&(this->_rel).targetPath._element.field_2;
  (this->_rel).targetPath._element._M_string_length = 0;
  (this->_rel).targetPath._element.field_2._M_local_buf[0] = '\0';
  (this->_rel).targetPath._path_type.has_value_ = false;
  (this->_rel).targetPath._path_type.contained = (storage_t<tinyusdz::Path::PathType>)0x0;
  (this->_rel).targetPath._valid = false;
  (this->_rel)._metas.interpolation.has_value_ = false;
  (this->_rel)._metas.interpolation.contained = (storage_t<tinyusdz::Interpolation>)0x0;
  (this->_rel)._metas.elementSize.has_value_ = false;
  (this->_rel)._metas.elementSize.contained = (storage_t<unsigned_int>)0x0;
  (this->_rel)._metas.hidden.has_value_ = false;
  (this->_rel)._metas.hidden.contained = (storage_t<bool>)0x0;
  (this->_rel)._metas.comment.has_value_ = false;
  (this->_rel)._metas.weight.contained = (storage_t<double>)0x0;
  (this->_rel)._metas.connectability.has_value_ = false;
  *(undefined8 *)((long)&(this->_rel)._metas.bindMaterialAs.contained + 0x10) = 0;
  *(undefined8 *)((long)&(this->_rel)._metas.bindMaterialAs.contained + 0x18) = 0;
  *(undefined8 *)&(this->_rel)._metas.bindMaterialAs.contained = 0;
  *(undefined8 *)((long)&(this->_rel)._metas.bindMaterialAs.contained + 8) = 0;
  p_Var3 = &(this->_rel)._metas.meta._M_t._M_impl.super__Rb_tree_header;
  (this->_rel)._metas.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  *(_Base_ptr *)((long)&(this->_rel)._metas.meta._M_t._M_impl.super__Rb_tree_header._M_header + 8) =
       (_Base_ptr)0x0;
  *(undefined8 *)&(this->_rel)._metas.comment.contained = 0;
  *(undefined8 *)((long)&(this->_rel)._metas.comment.contained + 8) = 0;
  *(undefined8 *)((long)&(this->_rel)._metas.comment.contained + 0x10) = 0;
  *(undefined8 *)((long)&(this->_rel)._metas.comment.contained + 0x18) = 0;
  *(undefined8 *)((long)&(this->_rel)._metas.comment.contained + 0x20) = 0;
  *(undefined8 *)((long)&(this->_rel)._metas.comment.contained + 0x28) = 0;
  (this->_rel)._metas.customData.has_value_ = false;
  (this->_rel)._metas.weight.has_value_ = false;
  *(undefined8 *)((long)&(this->_rel)._metas.customData.contained + 0x20) = 0;
  *(undefined8 *)((long)&(this->_rel)._metas.customData.contained + 0x28) = 0;
  *(undefined8 *)((long)&(this->_rel)._metas.customData.contained + 0x10) = 0;
  *(undefined8 *)((long)&(this->_rel)._metas.customData.contained + 0x18) = 0;
  *(undefined8 *)&(this->_rel)._metas.customData.contained = 0;
  *(undefined8 *)((long)&(this->_rel)._metas.customData.contained + 8) = 0;
  (this->_rel)._metas.outputName.has_value_ = false;
  *(undefined8 *)((long)&(this->_rel)._metas.connectability.contained + 0x10) = 0;
  *(undefined8 *)((long)&(this->_rel)._metas.connectability.contained + 0x18) = 0;
  *(undefined8 *)&(this->_rel)._metas.connectability.contained = 0;
  *(undefined8 *)((long)&(this->_rel)._metas.connectability.contained + 8) = 0;
  *(undefined8 *)&(this->_rel)._metas.outputName.contained = 0;
  *(undefined8 *)((long)&(this->_rel)._metas.outputName.contained + 8) = 0;
  *(undefined8 *)((long)&(this->_rel)._metas.outputName.contained + 0x10) = 0;
  *(undefined8 *)((long)&(this->_rel)._metas.outputName.contained + 0x18) = 0;
  (this->_rel)._metas.renderType.has_value_ = false;
  (this->_rel)._metas.sdrMetadata.has_value_ = false;
  *(undefined8 *)((long)&(this->_rel)._metas.renderType.contained + 0x10) = 0;
  *(undefined8 *)((long)&(this->_rel)._metas.renderType.contained + 0x18) = 0;
  *(undefined8 *)&(this->_rel)._metas.renderType.contained = 0;
  *(undefined8 *)((long)&(this->_rel)._metas.renderType.contained + 8) = 0;
  (this->_rel)._metas.displayName.has_value_ = false;
  *(undefined8 *)((long)&(this->_rel)._metas.sdrMetadata.contained + 0x20) = 0;
  *(undefined8 *)((long)&(this->_rel)._metas.sdrMetadata.contained + 0x28) = 0;
  *(undefined8 *)((long)&(this->_rel)._metas.sdrMetadata.contained + 0x10) = 0;
  *(undefined8 *)((long)&(this->_rel)._metas.sdrMetadata.contained + 0x18) = 0;
  *(undefined8 *)&(this->_rel)._metas.sdrMetadata.contained = 0;
  *(undefined8 *)((long)&(this->_rel)._metas.sdrMetadata.contained + 8) = 0;
  (this->_rel)._metas.displayGroup.has_value_ = false;
  *(undefined8 *)((long)&(this->_rel)._metas.displayName.contained + 0x10) = 0;
  *(undefined8 *)((long)&(this->_rel)._metas.displayName.contained + 0x18) = 0;
  *(undefined8 *)&(this->_rel)._metas.displayName.contained = 0;
  *(undefined8 *)((long)&(this->_rel)._metas.displayName.contained + 8) = 0;
  (this->_rel)._metas.bindMaterialAs.has_value_ = false;
  *(undefined8 *)((long)&(this->_rel)._metas.displayGroup.contained + 0x10) = 0;
  *(undefined8 *)((long)&(this->_rel)._metas.displayGroup.contained + 0x18) = 0;
  *(undefined8 *)&(this->_rel)._metas.displayGroup.contained = 0;
  *(undefined8 *)((long)&(this->_rel)._metas.displayGroup.contained + 8) = 0;
  *(undefined8 *)
   ((long)&(this->_rel).targetPathVector.
           super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->_rel).targetPathVector.
           super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (this->_rel).targetPathVector.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_rel).targetPathVector.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(_Rb_tree_header **)
   ((long)&(this->_rel)._metas.meta._M_t._M_impl.super__Rb_tree_header._M_header + 0x10) = p_Var3;
  *(_Rb_tree_header **)
   ((long)&(this->_rel)._metas.meta._M_t._M_impl.super__Rb_tree_header._M_header + 0x18) = p_Var3;
  (this->_rel)._varying_authored = false;
  (this->_rel)._metas.stringData.
  super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_rel)._metas.stringData.
  super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_rel)._metas.meta._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->_rel)._metas.stringData.
  super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_prop_value_type_name)._M_dataplus._M_p = (pointer)&(this->_prop_value_type_name).field_2;
  (this->_prop_value_type_name)._M_string_length = 0;
  (this->_prop_value_type_name).field_2._M_local_buf[0] = '\0';
  this->_has_custom = custom;
  this->_type = Attrib;
  return;
}

Assistant:

Property(Attribute &&a, bool custom = false)
      : _attrib(std::move(a)), _has_custom(custom) {
    _type = Type::Attrib;
  }